

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20.cpp
# Opt level: O2

void __thiscall
FSChaCha20::Crypt(FSChaCha20 *this,Span<const_std::byte> input,Span<std::byte> output)

{
  long lVar1;
  uint32_t uVar2;
  uint64_t uVar3;
  long in_FS_OFFSET;
  Span<std::byte> out;
  Span<const_std::byte> key;
  Span<std::byte> output_00;
  byte new_key [32];
  
  output_00.m_data = output.m_data;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (input.m_size != output.m_size) {
    __assert_fail("input.size() == output.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/crypto/chacha20.cpp"
                  ,0x160,"void FSChaCha20::Crypt(Span<const std::byte>, Span<std::byte>)");
  }
  output_00.m_size = input.m_size;
  ChaCha20::Crypt(&this->m_chacha20,input,output_00);
  uVar2 = this->m_chunk_counter + 1;
  this->m_chunk_counter = uVar2;
  if (uVar2 == this->m_rekey_interval) {
    out.m_size = 0x20;
    out.m_data = new_key;
    ChaCha20::Keystream(&this->m_chacha20,out);
    key.m_size = 0x20;
    key.m_data = new_key;
    ChaCha20::SetKey(&this->m_chacha20,key);
    memory_cleanse(new_key,0x20);
    uVar3 = this->m_rekey_counter + 1;
    this->m_rekey_counter = uVar3;
    (this->m_chacha20).m_aligned.input[8] = 0;
    (this->m_chacha20).m_aligned.input[9] = 0;
    *(uint64_t *)((this->m_chacha20).m_aligned.input + 10) = uVar3;
    (this->m_chacha20).m_bufleft = 0;
    this->m_chunk_counter = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void FSChaCha20::Crypt(Span<const std::byte> input, Span<std::byte> output) noexcept
{
    assert(input.size() == output.size());

    // Invoke internal stream cipher for actual encryption/decryption.
    m_chacha20.Crypt(input, output);

    // Rekey after m_rekey_interval encryptions/decryptions.
    if (++m_chunk_counter == m_rekey_interval) {
        // Get new key from the stream cipher.
        std::byte new_key[KEYLEN];
        m_chacha20.Keystream(new_key);
        // Update its key.
        m_chacha20.SetKey(new_key);
        // Wipe the key (a copy remains inside m_chacha20, where it'll be wiped on the next rekey
        // or on destruction).
        memory_cleanse(new_key, sizeof(new_key));
        // Set the nonce for the new section of output.
        m_chacha20.Seek({0, ++m_rekey_counter}, 0);
        // Reset the chunk counter.
        m_chunk_counter = 0;
    }
}